

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLPrinter::PushHeader(XMLPrinter *this,bool writeBOM,bool writeDec)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,writeBOM) != 0) {
    Write(this,(char *)PushHeader::bom,3);
  }
  if (writeDec) {
    PushDeclaration(this,"xml version=\"1.0\"");
    return;
  }
  return;
}

Assistant:

void XMLPrinter::PushHeader(bool writeBOM, bool writeDec)
{
    if (writeBOM) {
        static const unsigned char bom[] = {TIXML_UTF_LEAD_0,
                                            TIXML_UTF_LEAD_1,
                                            TIXML_UTF_LEAD_2,
                                            0};
        Write(reinterpret_cast<const char*>(bom));
    }
    if (writeDec) {
        PushDeclaration("xml version=\"1.0\"");
    }
}